

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O2

int __thiscall
icu_63::DateTimeRule::clone
          (DateTimeRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DateTimeRule *this_00;
  
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  if (this_00 != (DateTimeRule *)0x0) {
    DateTimeRule(this_00,this);
  }
  return (int)this_00;
}

Assistant:

DateTimeRule*
DateTimeRule::clone() const {
    return new DateTimeRule(*this);
}